

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

QXmlStreamNamespaceDeclarations * __thiscall
QXmlStreamReader::namespaceDeclarations(QXmlStreamReader *this)

{
  bool bVar1;
  QXmlStreamReaderPrivate *pQVar2;
  QList<QXmlStreamNamespaceDeclaration> *in_RDI;
  QXmlStreamReaderPrivate *in_stack_00000008;
  QXmlStreamReaderPrivate *d;
  QList<QXmlStreamNamespaceDeclaration> *this_00;
  
  this_00 = in_RDI;
  pQVar2 = d_func((QXmlStreamReader *)0x64a228);
  bVar1 = QList<QXmlStreamNamespaceDeclaration>::isEmpty
                    ((QList<QXmlStreamNamespaceDeclaration> *)0x64a23e);
  if ((bVar1) && (pQVar2->type == StartElement)) {
    QXmlStreamReaderPrivate::resolvePublicNamespaces(in_stack_00000008);
  }
  QList<QXmlStreamNamespaceDeclaration>::QList(this_00,in_RDI);
  return this_00;
}

Assistant:

QXmlStreamNamespaceDeclarations QXmlStreamReader::namespaceDeclarations() const
{
    Q_D(const QXmlStreamReader);
    if (d->publicNamespaceDeclarations.isEmpty() && d->type == StartElement)
        const_cast<QXmlStreamReaderPrivate *>(d)->resolvePublicNamespaces();
    return d->publicNamespaceDeclarations;
}